

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
::insert_node<std::pair<std::__cxx11::string,pstore::extent<char>>>
          (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,index_pointer node,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
          *value,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  size_t __n;
  undefined1 auVar1 [12];
  _Alloc_hider _Var2;
  int iVar3;
  ulong uVar4;
  pair<pstore::index::details::index_pointer,_bool> pVar5;
  index_pointer node_local;
  key_type existing_key;
  database *local_40;
  index_pointer local_38;
  
  node_local = node;
  if (((ulong)node.internal_ & 1) == 0) {
    if (((ulong)node.internal_ & 2) != 0) {
      __assert_fail("is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                    ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
    }
    local_40 = transaction->db_;
    local_38 = node;
    serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
              (&existing_key,(serialize *)&local_40,(database_reader *)node.internal_);
    _Var2 = existing_key._M_dataplus;
    __n = (value->first)._M_string_length;
    if ((__n == existing_key._M_string_length) &&
       ((__n == 0 ||
        (iVar3 = bcmp((value->first)._M_dataplus._M_p,existing_key._M_dataplus._M_p,__n), iVar3 == 0
        )))) {
      if (is_upsert) {
        node.addr_ = store_leaf_node<std::pair<std::__cxx11::string,pstore::extent<char>>>
                               (this,transaction,value,parents);
      }
      else {
        uVar4 = (parents.ptr_)->elements_;
        if (0xc < uVar4) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        (parents.ptr_)->elements_ = uVar4 + 1;
        ((parents.ptr_)->c_)._M_elems[uVar4].node = node;
        ((parents.ptr_)->c_)._M_elems[uVar4].position = 0xffffffffffffffff;
      }
      uVar4 = CONCAT71((int7)(existing_key._M_string_length >> 8),1);
    }
    else {
      uVar4 = std::_Hash_bytes(_Var2._M_p,existing_key._M_string_length,0xc70f6907);
      node = insert_into_leaf<std::pair<std::__cxx11::string,pstore::extent<char>>>
                       (this,transaction,&node_local,value,uVar4 >> ((byte)shifts & 0x3f),hash,
                        shifts,parents);
      uVar4 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)existing_key._M_dataplus._M_p != &existing_key.field_2) {
      operator_delete(existing_key._M_dataplus._M_p,existing_key.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (shifts < 0x42) {
      pVar5 = insert_into_internal<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,transaction,node,value,hash,shifts,parents,is_upsert);
      auVar1 = pVar5._0_12_;
    }
    else {
      pVar5 = insert_into_linear<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,transaction,node,value,parents,is_upsert);
      auVar1 = pVar5._0_12_;
    }
    node = auVar1._0_8_;
    uVar4 = (ulong)auVar1._8_4_;
  }
  pVar5._8_8_ = uVar4 & 0xffffffff;
  pVar5.first.internal_ = node.internal_;
  return pVar5;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }